

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tandem.hpp
# Opt level: O3

vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
* __thiscall
tandem::detail::get_sorted_buckets<std::__cxx11::string>
          (vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
           *__return_storage_ptr__,detail *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
          vector<tandem::LZBlock,_std::allocator<tandem::LZBlock>_> *lz_blocks,uint32_t min_period,
          uint32_t max_period)

{
  vector<tandem::Repeat,std::allocator<tandem::Repeat>> *this_00;
  pointer pRVar1;
  iterator __position;
  uint32_t uVar2;
  vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *bucket;
  pointer __c;
  Repeat *run;
  pointer __args;
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  end_buckets;
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  local_40;
  
  get_end_buckets<std::__cxx11::string>(&local_40,this,str,lz_blocks,min_period,max_period);
  get_init_buckets(__return_storage_ptr__,*(size_t *)(this + 8),&local_40);
  for (__c = local_40.
             super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __c != local_40.
             super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; __c = __c + 1) {
    __args = (__c->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pRVar1 = (__c->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (__args != pRVar1) {
      do {
        this_00 = (vector<tandem::Repeat,std::allocator<tandem::Repeat>> *)
                  ((__return_storage_ptr__->
                   super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + __args->pos);
        __position._M_current = *(Repeat **)(this_00 + 8);
        if (__position._M_current == *(Repeat **)(this_00 + 0x10)) {
          std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>::
          _M_realloc_insert<tandem::Repeat_const&>(this_00,__position,__args);
        }
        else {
          (__position._M_current)->period = __args->period;
          uVar2 = __args->length;
          (__position._M_current)->pos = __args->pos;
          (__position._M_current)->length = uVar2;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0xc;
        }
        __args = __args + 1;
      } while (__args != pRVar1);
      pRVar1 = (__c->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __args = (__c->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (__args != pRVar1) {
        (__c->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
        super__Vector_impl_data._M_finish = pRVar1;
        __args = pRVar1;
      }
    }
    if ((__c->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage != __args) {
      std::__shrink_to_fit_aux<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_true>::
      _S_do_it(__c);
    }
  }
  std::
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  ::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Repeat>>
get_sorted_buckets(const T& str, const std::vector<LZBlock>& lz_blocks,
                   const std::uint32_t min_period, const std::uint32_t max_period)
{
    auto end_buckets = get_end_buckets(str, lz_blocks, min_period, max_period);
    auto result = get_init_buckets(str.size(), end_buckets);
    for (auto& bucket : end_buckets) {
        for (const auto& run : bucket) {
            result[run.pos].push_back(run);
        }
        bucket.clear();
        bucket.shrink_to_fit();
    }
    return result;
}